

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtmul<wabt::interp::Simd<short,(unsigned_char)8>,wabt::interp::Simd<signed_char,(unsigned_char)16>,false>
          (Thread *this)

{
  u8 laneidx;
  long lVar1;
  Simd<short,_(unsigned_char)__b_> result;
  Simd<signed_char,_(unsigned_char)__x10_> lhs;
  Simd<signed_char,_(unsigned_char)__x10_> rhs;
  short asStack_48 [4];
  undefined8 uStack_40;
  anon_union_16_6_113bff37_for_Value_0 local_38;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  uStack_40 = 0x1cd293;
  local_18.v128_.v = (v128)Pop(this);
  uStack_40 = 0x1cd2a5;
  local_28.v128_.v = (v128)Pop(this);
  lVar1 = 8;
  do {
    asStack_48[lVar1] =
         (short)*(char *)((long)&local_18 + lVar1) * (short)*(char *)((long)&local_28 + lVar1);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  uStack_40 = 0x1cd2e0;
  Push(this,(Value)local_38.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtmul() {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = (low ? 0 : S::lanes) + i;
    result[i] = U(lhs[laneidx]) * U(rhs[laneidx]);
  }
  Push(result);
  return RunResult::Ok;
}